

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O2

void mono8_converter(uchar *from,uchar *to,int w,int delta)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  long lStack_50;
  
  if (dir == 1) {
    from = from + (w + -1) * delta;
    to = to + (long)w + -1;
    delta = -delta;
    lStack_50 = -1;
  }
  else {
    lStack_50 = 1;
  }
  dir = dir ^ 1;
  iVar5 = ri;
  iVar2 = gi;
  iVar3 = bi;
  while (bVar7 = w != 0, w = w + -1, bVar7) {
    bVar1 = *from;
    iVar5 = iVar5 + (uint)bVar1;
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    uVar4 = iVar2 + (uint)bVar1;
    if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    iVar3 = iVar3 + (uint)bVar1;
    if (0xfe < iVar3) {
      iVar3 = 0xff;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar2 = ((uint)(iVar3 * 5) >> 8) * 5 + ((uint)(iVar5 * 5) >> 8);
    uVar6 = (ulong)((uVar4 >> 5) + iVar2 * 8);
    if (fl_xmap[0][uVar6 + 0x38].mapped == '\0') {
      if (fl_redmask == '\0') {
        fl_xpixel((uchar)iVar5,(uchar)uVar4,(uchar)iVar3);
      }
      else {
        fl_xpixel((uVar4 >> 5) + iVar2 * 8 + 0x38);
      }
    }
    iVar5 = iVar5 - (uint)fl_xmap[0][uVar6 + 0x38].r;
    iVar2 = uVar4 - fl_xmap[0][uVar6 + 0x38].g;
    iVar3 = iVar3 - (uint)fl_xmap[0][uVar6 + 0x38].b;
    *to = (uchar)fl_xmap[0][uVar6 + 0x38].pixel;
    from = from + delta;
    to = to + lStack_50;
  }
  ri = iVar5;
  gi = iVar2;
  bi = iVar3;
  return;
}

Assistant:

static void mono8_converter(const uchar *from, uchar *to, int w, int delta) {
  int r=ri, g=gi, b=bi;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    to = to+(w-1);
    d = -delta;
    td = -1;
  } else {
    dir = 1;
    d = delta;
    td = 1;
  }
  for (; w--; from += d, to += td) {
    r += from[0]; if (r < 0) r = 0; else if (r>255) r = 255;
    g += from[0]; if (g < 0) g = 0; else if (g>255) g = 255;
    b += from[0]; if (b < 0) b = 0; else if (b>255) b = 255;
    Fl_Color i = fl_color_cube(r*FL_NUM_RED/256,g*FL_NUM_GREEN/256,b*FL_NUM_BLUE/256);
    Fl_XColor& xmap = fl_xmap[0][i];
    if (!xmap.mapped) {if (!fl_redmask) fl_xpixel(r,g,b); else fl_xpixel(i);}
    r -= xmap.r;
    g -= xmap.g;
    b -= xmap.b;
    *to = uchar(xmap.pixel);
  }
  ri = r; gi = g; bi = b;
}